

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
* __thiscall
Catch::ExprLhs<std::vector<unsigned_int,std::allocator<unsigned_int>>const&>::operator==
          (BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
           *__return_storage_ptr__,
          ExprLhs<std::vector<unsigned_int,std::allocator<unsigned_int>>const&> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rhs)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = std::operator==(*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this,rhs);
  pvVar1 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022dc90;
  __return_storage_ptr__->m_lhs = pvVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }